

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

LogicalType * __thiscall
duckdb_parquet::LogicalType::operator=(LogicalType *this,LogicalType *other53)

{
  int32_t iVar1;
  
  iVar1 = (other53->DECIMAL).precision;
  (this->DECIMAL).scale = (other53->DECIMAL).scale;
  (this->DECIMAL).precision = iVar1;
  (this->TIME).isAdjustedToUTC = (other53->TIME).isAdjustedToUTC;
  (this->TIME).unit.__isset = (other53->TIME).unit.__isset;
  (this->TIMESTAMP).isAdjustedToUTC = (other53->TIMESTAMP).isAdjustedToUTC;
  (this->TIMESTAMP).unit.__isset = (other53->TIMESTAMP).unit.__isset;
  (this->INTEGER).bitWidth = (other53->INTEGER).bitWidth;
  (this->INTEGER).isSigned = (other53->INTEGER).isSigned;
  this->__isset = other53->__isset;
  return this;
}

Assistant:

LogicalType& LogicalType::operator=(const LogicalType& other53) noexcept {
  STRING = other53.STRING;
  MAP = other53.MAP;
  LIST = other53.LIST;
  ENUM = other53.ENUM;
  DECIMAL = other53.DECIMAL;
  DATE = other53.DATE;
  TIME = other53.TIME;
  TIMESTAMP = other53.TIMESTAMP;
  INTEGER = other53.INTEGER;
  UNKNOWN = other53.UNKNOWN;
  JSON = other53.JSON;
  BSON = other53.BSON;
  UUID = other53.UUID;
  FLOAT16 = other53.FLOAT16;
  __isset = other53.__isset;
  return *this;
}